

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coveragetocsv.cpp
# Opt level: O1

void coveragetocsv::doit(bool skipheader)

{
  undefined8 in_RAX;
  size_t sVar1;
  uint uVar2;
  undefined7 in_register_00000039;
  OASIS_FLOAT tiv;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  if ((int)CONCAT71(in_register_00000039,skipheader) == 0) {
    puts("coverage_id,tiv");
  }
  sVar1 = fread((void *)((long)&uStack_28 + 4),4,1,_stdin);
  if (sVar1 != 0) {
    uVar2 = 1;
    do {
      printf("%d, %f\n",(double)uStack_28._4_4_,(ulong)uVar2);
      sVar1 = fread((void *)((long)&uStack_28 + 4),4,1,_stdin);
      uVar2 = uVar2 + 1;
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void doit(bool skipheader)
	{

		if(skipheader == false) printf("coverage_id,tiv\n");
		
		OASIS_FLOAT tiv;
		int id = 0;
		size_t i = fread(&tiv, sizeof(tiv), 1, stdin);
		while (i != 0) {
			id++;
			printf("%d, %f\n", id, tiv);
			i = fread(&tiv, sizeof(tiv), 1, stdin);
		}
	}